

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

Data pop(Stack stack)

{
  element *__ptr;
  Data pvVar1;
  Data data;
  element *el;
  Stack stack_local;
  
  __ptr = stack->top;
  pvVar1 = __ptr->data;
  stack->top = __ptr->next;
  stack->size = stack->size - 1;
  free(__ptr);
  return pvVar1;
}

Assistant:

Data pop(Stack stack) {
    struct element *el = stack->top;
    Data data = el->data;
    stack->top = el->next;
    stack->size--;
    free(el);
    return data;
}